

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseClicked(ImGuiMouseButton button,bool repeat)

{
  float *pfVar1;
  float t1;
  int iVar2;
  byte in_SIL;
  int in_EDI;
  float t;
  ImGuiContext *g;
  bool local_1;
  
  t1 = (GImGui->IO).MouseDownDuration[in_EDI];
  if ((t1 != 0.0) || (NAN(t1))) {
    if (((in_SIL & 1) == 0) ||
       (pfVar1 = &(GImGui->IO).KeyRepeatDelay, t1 < *pfVar1 || t1 == *pfVar1)) {
      local_1 = false;
    }
    else {
      iVar2 = CalcTypematicRepeatAmount
                        (t1 - (GImGui->IO).DeltaTime,t1,(GImGui->IO).KeyRepeatDelay,
                         (GImGui->IO).KeyRepeatRate);
      local_1 = 0 < iVar2;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::IsMouseClicked(ImGuiMouseButton button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}